

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

bool __thiscall qpdf::Array::insert(Array *this,int at,QPDFObjectHandle *item)

{
  pointer pQVar1;
  int iVar2;
  QPDF_Array *pQVar3;
  _Rb_tree_node_base *p_Var4;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *this_00;
  reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_int,_QPDFObjectHandle>_>_> __tmp;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var5;
  int key;
  node_type nh;
  int local_8c;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_88;
  node_type local_78;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *local_60;
  insert_return_type local_58;
  
  local_8c = at;
  pQVar3 = array(this);
  iVar2 = size(this);
  if (at <= iVar2 && -1 < at) {
    if (iVar2 == at) {
      push_back(this,item);
    }
    else {
      checkOwnership(this,item);
      _Var5._M_head_impl =
           (pQVar3->sp)._M_t.
           super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
           super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
           super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
      if (_Var5._M_head_impl == (Sparse *)0x0) {
        pQVar1 = (pQVar3->elements).
                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_88,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)item);
        local_78.
        super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
        ._M_ptr = (pointer)local_88._M_ptr;
        local_78._M_pkey = (__pointer<int>)local_88._M_refcount._M_pi;
        local_88._M_ptr = (element_type *)0x0;
        local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_insert_rval
                  (&pQVar3->elements,pQVar1 + (uint)at,(value_type *)&local_78);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_pkey);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
      }
      else {
        p_Var4 = (_Rb_tree_node_base *)((long)&(_Var5._M_head_impl)->elements + 8);
        local_60 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)item;
        while (p_Var4 != *(_Base_ptr *)((long)&((_Var5._M_head_impl)->elements)._M_t + 0x18)) {
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var4);
          local_88._M_ptr = (element_type *)CONCAT44(local_88._M_ptr._4_4_,p_Var4[1]._M_color);
          if ((int)p_Var4[1]._M_color < at) break;
          std::
          _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
          ::extract(&local_78,&((_Var5._M_head_impl)->elements)._M_t,(key_type *)&local_88);
          *local_78._M_pkey = *local_78._M_pkey + 1;
          std::
          _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
          ::_M_reinsert_node_unique
                    (&local_58,
                     &(((pQVar3->sp)._M_t.
                        super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                        .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)->elements)
                      ._M_t,&local_78);
          std::
          _Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
          ::~_Node_handle_common
                    (&local_58.node.
                      super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                    );
          std::
          _Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
          ::~_Node_handle_common
                    (&local_78.
                      super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                    );
          _Var5._M_head_impl =
               (pQVar3->sp)._M_t.
               super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>.
               _M_t.
               super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
               .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
        }
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_88,local_60);
        local_78.
        super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
        ._M_ptr = (pointer)local_88._M_ptr;
        local_78._M_pkey = (__pointer<int>)local_88._M_refcount._M_pi;
        local_88._M_ptr = (element_type *)0x0;
        local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                  std::
                  map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                  ::operator[](&((pQVar3->sp)._M_t.
                                 super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                                 .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)->
                                elements,&local_8c);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (this_00,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_pkey);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
        _Var5._M_head_impl =
             (pQVar3->sp)._M_t.
             super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>.
             _M_t.
             super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
             super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
        (_Var5._M_head_impl)->size = (_Var5._M_head_impl)->size + 1;
      }
    }
  }
  return at <= iVar2 && -1 < at;
}

Assistant:

bool
Array::insert(int at, QPDFObjectHandle const& item)
{
    auto a = array();
    int sz = size();
    if (at < 0 || at > sz) {
        // As special case, also allow insert beyond the end
        return false;
    } else if (at == sz) {
        push_back(item);
    } else {
        checkOwnership(item);
        if (a->sp) {
            auto iter = a->sp->elements.crbegin();
            while (iter != a->sp->elements.crend()) {
                auto key = (iter++)->first;
                if (key >= at) {
                    auto nh = a->sp->elements.extract(key);
                    ++nh.key();
                    a->sp->elements.insert(std::move(nh));
                } else {
                    break;
                }
            }
            a->sp->elements[at] = item.getObj();
            ++a->sp->size;
        } else {
            a->elements.insert(a->elements.cbegin() + at, item.getObj());
        }
    }
    return true;
}